

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

_Bool duckdb_je_background_thread_boot1(tsdn_t *tsdn,base_t *base)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  background_thread_info_t *info;
  background_thread_info_t *pbVar5;
  bool bVar6;
  
  if (0xfff < duckdb_je_opt_max_background_threads) {
    duckdb_je_opt_max_background_threads = 4;
  }
  duckdb_je_background_thread_enabled_state.repr = duckdb_je_opt_background_thread;
  duckdb_je_max_background_threads = duckdb_je_opt_max_background_threads;
  _Var1 = duckdb_je_malloc_mutex_init
                    (&duckdb_je_background_thread_lock,"background_thread_global",
                     WITNESS_RANK_BACKGROUND_THREAD_GLOBAL,malloc_mutex_rank_exclusive);
  bVar6 = true;
  if ((!_Var1) &&
     (duckdb_je_background_thread_info =
           (background_thread_info_t *)
           duckdb_je_base_alloc(tsdn,base,duckdb_je_opt_max_background_threads * 0xd0,0x40),
     duckdb_je_background_thread_info != (background_thread_info_t *)0x0)) {
    uVar3 = 0;
    while( true ) {
      pbVar5 = duckdb_je_background_thread_info;
      uVar4 = (ulong)uVar3;
      bVar6 = uVar4 < duckdb_je_max_background_threads;
      if (duckdb_je_max_background_threads <= uVar4) break;
      info = (background_thread_info_t *)&duckdb_je_background_thread_info[uVar4].mtx;
      _Var1 = duckdb_je_malloc_mutex_init
                        ((malloc_mutex_t *)info,"background_thread",WITNESS_RANK_BACKGROUND_THREAD,
                         malloc_mutex_address_ordered);
      if (_Var1) {
        return bVar6;
      }
      pbVar5 = pbVar5 + uVar4;
      iVar2 = pthread_cond_init((pthread_cond_t *)&pbVar5->cond,(pthread_condattr_t *)0x0);
      if (iVar2 != 0) {
        return bVar6;
      }
      malloc_mutex_lock(tsdn,(malloc_mutex_t *)info);
      pbVar5->state = background_thread_stopped;
      background_thread_info_init((tsdn_t *)pbVar5,info);
      (pbVar5->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar5->mtx).field_0 + 0x48));
      uVar3 = uVar3 + 1;
    }
  }
  return bVar6;
}

Assistant:

bool
background_thread_boot1(tsdn_t *tsdn, base_t *base) {
#ifdef JEMALLOC_BACKGROUND_THREAD
	assert(have_background_thread);
	assert(narenas_total_get() > 0);

	if (opt_max_background_threads > MAX_BACKGROUND_THREAD_LIMIT) {
		opt_max_background_threads = DEFAULT_NUM_BACKGROUND_THREAD;
	}
	max_background_threads = opt_max_background_threads;

	background_thread_enabled_set(tsdn, opt_background_thread);
	if (malloc_mutex_init(&background_thread_lock,
	    "background_thread_global",
	    WITNESS_RANK_BACKGROUND_THREAD_GLOBAL,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}

	background_thread_info = (background_thread_info_t *)base_alloc(tsdn,
	    base, opt_max_background_threads *
	    sizeof(background_thread_info_t), CACHELINE);
	if (background_thread_info == NULL) {
		return true;
	}

	for (unsigned i = 0; i < max_background_threads; i++) {
		background_thread_info_t *info = &background_thread_info[i];
		/* Thread mutex is rank_inclusive because of thread0. */
		if (malloc_mutex_init(&info->mtx, "background_thread",
		    WITNESS_RANK_BACKGROUND_THREAD,
		    malloc_mutex_address_ordered)) {
			return true;
		}
		if (pthread_cond_init(&info->cond, NULL)) {
			return true;
		}
		malloc_mutex_lock(tsdn, &info->mtx);
		info->state = background_thread_stopped;
		background_thread_info_init(tsdn, info);
		malloc_mutex_unlock(tsdn, &info->mtx);
	}
#endif

	return false;
}